

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_10.hpp
# Opt level: O0

result_type __thiscall
boost::phoenix::detail::call_impl<$999073d4$>::operator()
          (call_impl<_999073d4_> *this,expr_param e,state_param s,data_param d)

{
  default_actions *in_R8;
  terminal<boost::spirit::tag::eps> local_71 [9];
  data_param d_local;
  state_param s_local;
  expr_param e_local;
  call_impl<_999073d4_> *this_local;
  state_param local_48;
  state_param local_40;
  state_param local_38;
  state_param local_30;
  state_param local_28;
  state_param local_20;
  state_param local_18;
  state_param local_10;
  
  d_local = d;
  s_local = s;
  e_local = e;
  this_local = this;
  local_48 = s;
  local_40 = s;
  local_38 = s;
  local_30 = s;
  local_28 = s;
  local_20 = s;
  local_18 = s;
  local_10 = s;
  context<boost::phoenix::vector3<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::greater_equal,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::phoenix::stl::size>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,0l>>>,2l>>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<int>,0l>>>,2l>>>,2l>>const*,boost::spirit::unused_type_const&,boost::spirit::unused_type_const&>,boost::phoenix::default_actions>
            ((vector3<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::greater_equal,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>_>_*,_const_boost::spirit::unused_type_&,_const_boost::spirit::unused_type_&>
              *)d,in_R8);
  function_eval::operator()
            ((function_eval *)this,local_71,
             (actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::greater_equal,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>
              *)s,(vector2<boost::phoenix::vector3<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::eps>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::greater_equal,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list2<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::stl::size>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_0L>_>_>,_2L>_>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<int>,_0L>_>_>,_2L>_>_>,_2L>_>_*,_const_boost::spirit::unused_type_&,_const_boost::spirit::unused_type_&>_&,_const_boost::phoenix::default_actions_&>
                   *)&s->a1);
  return (result_type)SUB82(this,0);
}

Assistant:

result_type operator()(
                typename call_impl::expr_param e
              , typename call_impl::state_param s
              , typename call_impl::data_param d
            ) const
            {
                return
                    Fun()(
                        proto::child_c< 0>(e) , proto::child_c< 1>(e)
                      , boost::phoenix::context(s, d)
                    );
            }